

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> * __thiscall
adios2::format::BP5Serializer::BreakoutContiguousMetadata
          (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *__return_storage_ptr__
          ,BP5Serializer *this,vector<char,_std::allocator<char>_> *Aggregate,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Counts,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *UniqueMetaMetaBlocks,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *DataSizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  pointer pcVar1;
  pointer pMVar2;
  size_t sVar3;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *this_00;
  int iVar4;
  long lVar5;
  size_t *psVar6;
  MetaMetaInfoBlock *o;
  pointer pMVar7;
  uint64_t IDLen;
  size_t __n;
  uint64_t MEBSize;
  long lVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  uint64_t element;
  value_type local_90;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  ulong local_60;
  vector<char,_std::allocator<char>_> *local_58;
  long local_50;
  pointer local_48;
  long local_40;
  size_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = 0;
  local_70 = AttributeBlocks;
  local_68 = Counts;
  local_58 = Aggregate;
  for (local_60 = 0;
      local_60 <
      (ulong)((long)(local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3); local_60 = local_60 + 1) {
    local_50 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar8);
    lVar8 = lVar8 + 8;
    lVar5 = 0;
    while( true ) {
      pcVar1 = (Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = *(size_t *)(pcVar1 + lVar8);
      if (lVar5 == local_50) break;
      local_38 = *(size_t *)(pcVar1 + lVar8 + 8);
      lVar10 = __n + 0x10 + lVar8;
      pMVar2 = (UniqueMetaMetaBlocks->
               super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = false;
      local_48 = pcVar1;
      local_40 = lVar5;
      for (pMVar7 = (UniqueMetaMetaBlocks->
                    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                    )._M_impl.super__Vector_impl_data._M_start; sVar9 = local_38,
          Aggregate = local_58, pMVar7 != pMVar2; pMVar7 = pMVar7 + 1) {
        if (pMVar7->MetaMetaIDLen == __n) {
          iVar4 = bcmp(pMVar7->MetaMetaID,pcVar1 + lVar8 + 0x10,__n);
          bVar11 = (bool)(bVar11 | iVar4 == 0);
        }
      }
      if (!bVar11) {
        local_90.MetaMetaInfo = local_48 + lVar10;
        local_90.MetaMetaInfoLen = local_38;
        local_90.MetaMetaID = pcVar1 + lVar8 + 0x10;
        local_90.MetaMetaIDLen = __n;
        std::
        vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ::push_back(UniqueMetaMetaBlocks,&local_90);
      }
      lVar8 = lVar10 + sVar9;
      lVar5 = local_40 + 1;
    }
    lVar8 = lVar8 + 8;
    while( true ) {
      this_00 = local_70;
      lVar5 = lVar8 + 8;
      pcVar1 = (Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar9 = *(size_t *)(pcVar1 + lVar8);
      bVar11 = __n == 0;
      __n = __n - 1;
      if (bVar11) break;
      local_90.MetaMetaInfo = pcVar1 + lVar5;
      local_90.MetaMetaInfoLen = sVar9;
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::
      emplace_back<adios2::core::iovec>(__return_storage_ptr__,(iovec *)&local_90);
      lVar8 = sVar9 + lVar5;
    }
    while (bVar11 = sVar9 != 0, sVar9 = sVar9 - 1, bVar11) {
      psVar6 = (size_t *)
               ((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar5);
      local_90.MetaMetaInfo = (char *)(psVar6 + 1);
      sVar3 = *psVar6;
      local_90.MetaMetaInfoLen = sVar3;
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::
      emplace_back<adios2::core::iovec>(this_00,(iovec *)&local_90);
      lVar5 = lVar5 + 8 + sVar3;
    }
    lVar10 = *(long *)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar5);
    lVar8 = lVar5 + 0x10;
    while( true ) {
      psVar6 = *(size_t **)
                ((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar8 + -8);
      bVar11 = lVar10 == 0;
      lVar10 = lVar10 + -1;
      if (bVar11) break;
      local_90.MetaMetaInfo = (char *)psVar6;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (DataSizes,(value_type_conflict9 *)&local_90);
      lVar8 = lVar8 + 8;
    }
    while (bVar11 = psVar6 != (size_t *)0x0, psVar6 = (size_t *)((long)psVar6 + -1), bVar11) {
      local_90.MetaMetaInfo =
           *(char **)((Aggregate->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (WriterDataPositions,(value_type_conflict9 *)&local_90);
      lVar8 = lVar8 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<core::iovec> BP5Serializer::BreakoutContiguousMetadata(
    std::vector<char> &Aggregate, const std::vector<size_t> Counts,
    std::vector<MetaMetaInfoBlock> &UniqueMetaMetaBlocks, std::vector<core::iovec> &AttributeBlocks,
    std::vector<uint64_t> &DataSizes, std::vector<uint64_t> &WriterDataPositions) const
{
    size_t Position = 0;
    std::vector<core::iovec> MetadataBlocks;
    // MetadataBlocks.reserve(Counts.size());
    // DataSizes.resize(Counts.size());
    for (size_t Rank = 0; Rank < Counts.size(); Rank++)
    {
        uint64_t NMMBCount, MBCount, ABCount, DSCount, WDPCount;
        helper::CopyFromBuffer(Aggregate.data(), Position, &NMMBCount);
        for (uint64_t i = 0; i < NMMBCount; i++)
        {
            uint64_t IDLen;
            uint64_t InfoLen;
            helper::CopyFromBuffer(Aggregate.data(), Position, &IDLen);
            helper::CopyFromBuffer(Aggregate.data(), Position, &InfoLen);
            uint64_t IDPosition = Position;
            uint64_t InfoPosition = Position + IDLen;
            Position = InfoPosition + InfoLen;
            bool Found = 0;
            for (auto &o : UniqueMetaMetaBlocks)
            {
                if (o.MetaMetaIDLen != IDLen)
                    continue;
                if (std::memcmp(o.MetaMetaID, Aggregate.data() + IDPosition, IDLen) == 0)
                    Found = true;
            }
            if (!Found)
            {
                MetaMetaInfoBlock New = {Aggregate.data() + InfoPosition, InfoLen,
                                         Aggregate.data() + IDPosition, IDLen};
                UniqueMetaMetaBlocks.push_back(New);
            }
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &MBCount);
        for (uint64_t i = 0; i < MBCount; ++i)
        {
            uint64_t MEBSize;
            helper::CopyFromBuffer(Aggregate.data(), Position, &MEBSize);
            MetadataBlocks.push_back({Aggregate.data() + Position, MEBSize});
            Position += MEBSize;
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &ABCount);
        for (uint64_t i = 0; i < ABCount; ++i)
        {
            uint64_t AEBSize;
            helper::CopyFromBuffer(Aggregate.data(), Position, &AEBSize);
            AttributeBlocks.push_back({Aggregate.data() + Position, AEBSize});
            Position += AEBSize;
        }
        uint64_t element;
        helper::CopyFromBuffer(Aggregate.data(), Position, &DSCount);
        for (uint64_t i = 0; i < DSCount; ++i)
        {
            helper::CopyFromBuffer(Aggregate.data(), Position, &element);
            DataSizes.push_back(element);
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &WDPCount);
        for (uint64_t i = 0; i < WDPCount; ++i)
        {
            helper::CopyFromBuffer(Aggregate.data(), Position, &element);
            WriterDataPositions.push_back(element);
        }
    }
    return MetadataBlocks;
}